

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  int iVar1;
  MainFunc *pMVar2;
  bool bVar3;
  ulong size;
  StringPtr *pSVar4;
  NullableValue<kj::Exception> *other;
  Exception *pEVar5;
  int *piVar6;
  Exception *params_1;
  size_t extraout_RDX;
  ArrayPtr<kj::StringPtr> AVar7;
  ArrayDisposer **local_4e0;
  CleanShutdownException *e;
  StringPtr local_4a8;
  Exception *local_498;
  Exception *exception;
  bool *local_488;
  _func_int **local_480;
  Maybe<kj::Exception> local_478;
  undefined1 local_2e0 [8];
  NullableValue<kj::Exception> _exception221;
  StringPtr *local_140;
  int local_134;
  undefined1 auStack_130 [4];
  int i;
  ArrayPtr<kj::StringPtr> params;
  Array<kj::StringPtr> params_heap;
  StringPtr params_stack [8];
  bool params_isOnStack;
  size_t params_size;
  Fault f;
  undefined1 local_60 [8];
  int *local_58;
  undefined1 local_50 [8];
  DebugComparison<int_&,_int> _kjCondition;
  char **argv_local;
  Exception *pEStack_18;
  int argc_local;
  MainFunc *func_local;
  ProcessContext *context_local;
  
  _kjCondition._32_8_ = argv;
  argv_local._4_4_ = argc;
  pEStack_18 = (Exception *)func;
  func_local = (MainFunc *)context;
  setStandardIoMode(0);
  setStandardIoMode(1);
  setStandardIoMode(2);
  local_58 = (int *)_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                               (int *)((long)&argv_local + 4));
  f.exception._0_4_ = 0;
  _::DebugExpression<int&>::operator>
            ((DebugComparison<int_&,_int> *)local_50,(DebugExpression<int&> *)&local_58,(int *)&f);
  bVar3 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar3) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&>
              ((Fault *)&params_size,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0xd4,FAILED,"argc > 0","_kjCondition,",(DebugComparison<int_&,_int> *)local_50);
    _::Debug::Fault::fatal((Fault *)&params_size);
  }
  size = (ulong)(argv_local._4_4_ + -1);
  local_4e0 = &params_heap.disposer;
  do {
    StringPtr::StringPtr((StringPtr *)local_4e0);
    local_4e0 = local_4e0 + 2;
  } while (local_4e0 != (ArrayDisposer **)&params_stack[7].content.size_);
  if (size < 9) {
    Array<kj::StringPtr>::Array((Array<kj::StringPtr> *)&params.size_,(void *)0x0);
    AVar7 = arrayPtr<kj::StringPtr>((StringPtr *)&params_heap.disposer,size);
    _auStack_130 = AVar7.ptr;
  }
  else {
    heapArray<kj::StringPtr>((Array<kj::StringPtr> *)&params.size_,size);
    AVar7 = Array::operator_cast_to_ArrayPtr((Array *)&params.size_);
    _auStack_130 = AVar7.ptr;
  }
  params.ptr = (StringPtr *)AVar7.size_;
  local_134 = 1;
  while( true ) {
    params_1 = (Exception *)AVar7.ptr;
    if (argv_local._4_4_ <= local_134) break;
    StringPtr::StringPtr
              ((StringPtr *)&_exception221.field_1.value.details.builder.disposer,
               *(char **)(_kjCondition._32_8_ + (long)local_134 * 8));
    pSVar4 = ArrayPtr<kj::StringPtr>::operator[]
                       ((ArrayPtr<kj::StringPtr> *)auStack_130,(long)(local_134 + -1));
    AVar7.size_ = extraout_RDX;
    AVar7.ptr = local_140;
    (pSVar4->content).ptr = (char *)_exception221.field_1.value.details.builder.disposer;
    (pSVar4->content).size_ = (size_t)local_140;
    local_134 = local_134 + 1;
  }
  exception = pEStack_18;
  local_488 = &_kjCondition.result;
  local_480 = (_func_int **)auStack_130;
  runCatchingExceptions<kj::runMainAndExit(kj::ProcessContext&,kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>&&,int,char**)::__0>
            (&local_478,(kj *)&exception,(anon_class_24_3_9ec25511 *)AVar7.size_);
  other = _::readMaybe<kj::Exception>(&local_478);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_2e0,other);
  Maybe<kj::Exception>::~Maybe(&local_478);
  pEVar5 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_2e0);
  if (pEVar5 != (Exception *)0x0) {
    local_498 = _::NullableValue<kj::Exception>::operator*
                          ((NullableValue<kj::Exception> *)local_2e0);
    pMVar2 = func_local;
    str<char_const(&)[28],kj::Exception&>
              ((String *)&e,(kj *)"*** Uncaught exception ***\n",(char (*) [28])local_498,params_1);
    StringPtr::StringPtr(&local_4a8,(String *)&e);
    (*(code *)(pMVar2->impl).disposer[3]._vptr_Disposer)
              (pMVar2,local_4a8.content.ptr,local_4a8.content.size_);
    String::~String((String *)&e);
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_2e0);
  (*(code *)(func_local->impl).disposer[1]._vptr_Disposer)();
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_2e0);
  Array<kj::StringPtr>::~Array((Array<kj::StringPtr> *)&params.size_);
  if (f.exception._4_4_ != 1) {
    _Unwind_Resume(local_60);
  }
  piVar6 = (int *)__cxa_begin_catch(local_60);
  iVar1 = *piVar6;
  __cxa_end_catch();
  return iVar1;
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

  try {
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_SOME(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", exception));
    }
    context.exit();
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}